

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void stmt(Vm *vm)

{
  TokenType TVar1;
  uint64_t uVar2;
  _Bool _Var3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t offset;
  TokenType in_ESI;
  char *err_message;
  Token local_50;
  
  TVar1 = (vm->compiler).token.type;
  if (TVar1 == TOKEN_EOF) {
    (vm->compiler).print_expr = false;
    return;
  }
  if (TVar1 == TOKEN_FOR) {
    (vm->compiler).print_expr = false;
    advance(vm);
    open_scope(vm);
    _Var3 = match(vm,TOKEN_SEMICOLON);
    if (!_Var3) {
      simple_stmt(vm);
      if ((vm->compiler).previous.type != TOKEN_SEMICOLON) {
        err_message = "Expected \';\' after for-initializer";
        goto LAB_0010437c;
      }
    }
    uVar2 = ((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).count;
    _Var3 = match(vm,TOKEN_SEMICOLON);
    if (!_Var3) {
      expr(vm);
      consume(&local_50,vm,TOKEN_SEMICOLON,"Expected \';\' after for-condition");
    }
    uVar5 = emit_jump(vm,OP_JMF);
    uVar6 = emit_jump(vm,OP_JMP);
    uVar4 = ((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).count;
    if ((vm->compiler).token.type != TOKEN_OPEN_BRACE) {
      assignment(vm);
      emit_no_arg(vm,OP_POP);
    }
    offset = emit_jump(vm,OP_JMP);
    if ((vm->compiler).token.type == TOKEN_OPEN_BRACE) {
      patch_jump_to(vm,uVar6,((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).count);
      loop_body(vm);
      uVar6 = emit_jump(vm,OP_JMP);
      patch_jump_to(vm,offset,uVar2);
      patch_jump_to(vm,uVar5,((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).count);
      patch_jump_to(vm,uVar6,uVar4);
      close_scope(vm);
      return;
    }
    err_message = "Expected \'{\' after assignment block in \'for\'";
  }
  else {
    if (TVar1 != TOKEN_RETURN) {
      if (TVar1 == TOKEN_WHILE) {
        (vm->compiler).print_expr = false;
        advance(vm);
        uVar2 = ((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).count;
        expr(vm);
        uVar4 = emit_jump(vm,OP_JMF);
        loop_body(vm);
        uVar5 = emit_jump(vm,OP_JMP);
        patch_jump_to(vm,uVar5,uVar2);
        patch_jump_to(vm,uVar4,((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).count
                     );
        return;
      }
      simple_stmt(vm);
      return;
    }
    if (1 < vm->frame_count) {
      (vm->compiler).print_expr = false;
      advance(vm);
      if ((vm->compiler).token.type == TOKEN_SEMICOLON) {
        advance(vm);
        emit_no_arg(vm,OP_NIL);
      }
      else {
        expr(vm);
        consume_optional(vm,in_ESI);
      }
      emit_no_arg(vm,OP_RETURN);
      return;
    }
    err_message = "Cannot return from global scope";
  }
LAB_0010437c:
  error(&vm->compiler,err_message);
}

Assistant:

static void stmt(Vm *vm) {
    switch (vm->compiler.token.type) {
        case TOKEN_WHILE:
            vm->compiler.print_expr = false;
            while_stmt(vm);
            break;
        case TOKEN_FOR:
            vm->compiler.print_expr = false;
            for_stmt(vm);
            break;
        case TOKEN_RETURN:
            if (vm->frame_count <= 1) {
                error(&vm->compiler, "Cannot return from global scope");
            }

            vm->compiler.print_expr = false;
            advance(vm);

            if (!check(vm, TOKEN_SEMICOLON)) {
                expr(vm);
                consume_optional(vm, TOKEN_SEMICOLON);
            } else {
                advance(vm);
                emit_no_arg(vm, OP_NIL);
            }

            emit_no_arg(vm, OP_RETURN);
            break;
        case TOKEN_EOF:
            vm->compiler.print_expr = false;
            break;
        default:
            simple_stmt(vm);
            break;
    }
}